

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfThenElseExpression.cpp
# Opt level: O0

BaseExpressionPtr __thiscall
Kandinsky::IfThenElseExpression::derivative
          (IfThenElseExpression *this,VariableExpressionPtr *variable)

{
  element_type *peVar1;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  BaseExpressionPtr BVar2;
  shared_ptr<Kandinsky::BaseExpression> *in_stack_00000028;
  shared_ptr<Kandinsky::BaseExpression> *in_stack_00000030;
  shared_ptr<Kandinsky::BaseExpression> *in_stack_00000038;
  Expression *in_stack_ffffffffffffff78;
  undefined1 local_50 [16];
  undefined1 local_40 [40];
  undefined8 local_18;
  
  local_18 = in_RDX;
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x138b15);
  (*peVar1->_vptr_BaseExpression[1])(local_40,peVar1,local_18);
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x138b39);
  (*peVar1->_vptr_BaseExpression[1])(local_50,peVar1,local_18);
  ifThenElse<std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (in_stack_00000038,in_stack_00000030,in_stack_00000028);
  BaseExpression::makePtr<Kandinsky::Expression>(in_stack_ffffffffffffff78);
  Expression::~Expression((Expression *)0x138b87);
  std::shared_ptr<Kandinsky::BaseExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::BaseExpression> *)0x138b91);
  std::shared_ptr<Kandinsky::BaseExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::BaseExpression> *)0x138b9b);
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (BaseExpressionPtr)
         BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr IfThenElseExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(ifThenElse(m_arg1, m_arg2->derivative(variable), m_arg3->derivative(variable)));
    }